

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

int __thiscall QToolButtonPrivate::init(QToolButtonPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  int iVar1;
  QToolBar *pQVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  code *pcVar4;
  undefined8 uVar5;
  undefined1 local_40 [16];
  undefined8 uStack_30;
  QWidgetData *local_20;
  
  local_20 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  this->defaultAction = (QAction *)0x0;
  this_00 = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  pQVar2 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>
                     (*(QObject **)
                       &(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x10);
  this->arrowType = NoArrow;
  this->toolButtonStyle = ToolButtonIconOnly;
  this->popupMode = DelayedPopup;
  this->field_0x2ec = (pQVar2 != (QToolBar *)0x0) << 3 | this->field_0x2ec & 0xf0;
  *(undefined4 *)&(this->super_QAbstractButtonPrivate).field_0x2b4 = 0;
  QWidget::setFocusPolicy(this_00,TabFocus);
  QWidget::setSizePolicy(this_00,(QSizePolicy)0xe000000);
  local_40._8_8_ = onButtonPressed;
  uStack_30._0_1_ = (QPaintDevice)0x0;
  uStack_30._1_7_ = 0;
  QObjectPrivate::connect<void(QAbstractButton::*)(),void(QToolButtonPrivate::*)()>
            ((Object *)&stack0xffffffffffffffd8,(offset_in_QAbstractButton_to_subr)this_00,
             (Object *)QAbstractButton::pressed,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd8);
  local_40._8_8_ = onButtonReleased;
  uStack_30._0_1_ = (QPaintDevice)0x0;
  uStack_30._1_7_ = 0;
  pcVar4 = onButtonReleased;
  uVar5 = 0;
  QObjectPrivate::connect<void(QAbstractButton::*)(),void(QToolButtonPrivate::*)()>
            ((Object *)local_40,(offset_in_QAbstractButton_to_subr)this_00,
             (Object *)QAbstractButton::released,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)this,SE_ToolButtonLayoutItem,(QStyleOption *)0x0);
  pQVar3 = QWidget::style(this_00);
  iVar1 = (**(code **)(*(long *)pQVar3 + 0xf0))
                    (pQVar3,0x34,0,this_00,0,*(long *)pQVar3,pcVar4,uVar5);
  this->delay = iVar1;
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(QWidgetData **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QToolButtonPrivate::init()
{
    Q_Q(QToolButton);
    defaultAction = nullptr;
#if QT_CONFIG(toolbar)
    if (qobject_cast<QToolBar*>(parent))
        autoRaise = true;
    else
#endif
        autoRaise = false;
    arrowType = Qt::NoArrow;
    menuButtonDown = false;
    popupMode = QToolButton::DelayedPopup;
    buttonPressed = QToolButtonPrivate::NoButtonPressed;

    toolButtonStyle = Qt::ToolButtonIconOnly;
    hoverControl = QStyle::SC_None;

    q->setFocusPolicy(Qt::TabFocus);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed,
                                 QSizePolicy::ToolButton));

#if QT_CONFIG(menu)
    QObjectPrivate::connect(q, &QAbstractButton::pressed,
                            this, &QToolButtonPrivate::onButtonPressed);
    QObjectPrivate::connect(q, &QAbstractButton::released,
                            this, &QToolButtonPrivate::onButtonReleased);
#endif

    setLayoutItemMargins(QStyle::SE_ToolButtonLayoutItem);
    delay = q->style()->styleHint(QStyle::SH_ToolButton_PopupDelay, nullptr, q);
}